

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

void __thiscall
discordpp::field<discordpp::RoleTags>::field
          (field<discordpp::RoleTags> *this,field<discordpp::RoleTags> *f)

{
  if ((f->t_)._M_t.
      super___uniq_ptr_impl<discordpp::RoleTags,_std::default_delete<discordpp::RoleTags>_>._M_t.
      super__Tuple_impl<0UL,_discordpp::RoleTags_*,_std::default_delete<discordpp::RoleTags>_>.
      super__Head_base<0UL,_discordpp::RoleTags_*,_false>._M_head_impl == (RoleTags *)0x0) {
    (this->t_)._M_t.
    super___uniq_ptr_impl<discordpp::RoleTags,_std::default_delete<discordpp::RoleTags>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::RoleTags_*,_std::default_delete<discordpp::RoleTags>_>.
    super__Head_base<0UL,_discordpp::RoleTags_*,_false>._M_head_impl = (RoleTags *)0x0;
  }
  else {
    std::make_unique<discordpp::RoleTags,discordpp::RoleTags&>((RoleTags *)this);
  }
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}